

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

bool __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::check_component_match_front
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  const_reverse_iterator item_rit;
  const_reverse_iterator query_rit;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  ReverseIterator local_58;
  ReverseIterator local_50;
  Iterator local_48;
  ReverseIterator local_40;
  ReverseIterator local_38;
  
  local_60._M_current =
       (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  _Var1._M_current =
       (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_48._M_current =
       (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var2._M_current =
       (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_40.current._M_current =
       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)_Var2._M_current;
  local_38.current._M_current =
       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)_Var1._M_current;
  consume_path_component_match_front
            (this,(ReverseIterator *)&local_60,&local_38,(ReverseIterator *)&local_48,&local_40);
  (this->qit_basename_)._M_current = local_48._M_current;
  this->whole_basename_match_ = local_48._M_current == (this->query_basename_)._M_current;
  this->basename_match_count_ =
       (long)(this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_48._M_current;
  while (local_48._M_current != _Var2._M_current) {
    if (local_60._M_current == _Var1._M_current) goto LAB_001327f9;
    local_58.current._M_current =
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         _Var2._M_current;
    local_50.current._M_current =
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
         _Var1._M_current;
    consume_path_component_match_front
              (this,(ReverseIterator *)&local_60,&local_50,(ReverseIterator *)&local_48,&local_58);
  }
  this->prefix_level_ = COMPONENT;
LAB_001327f9:
  return local_48._M_current == _Var2._M_current;
}

Assistant:

bool check_component_match_front() {
    auto item_rit = item_.crbegin();
    auto const item_rlast = item_.crend();
    auto query_rit = query_.crbegin();
    auto const query_rlast = query_.crend();

    // Consume the basename.
    consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                       query_rlast);
    qit_basename_ = query_rit.base();
    whole_basename_match_ = qit_basename_ == query_basename_;
    basename_match_count_ = query_.cend() - qit_basename_;

    // Try to consume the remainder of the query.
    while (query_rit != query_rlast) {
      if (item_rit == item_rlast) {
        return false;
      }
      consume_path_component_match_front(item_rit, item_rlast, query_rit,
                                         query_rlast);
    }
    prefix_level_ = PrefixLevel::COMPONENT;
    return true;
  }